

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall
kj::Exception::Exception(Exception *this,Type type,String *file,int line,String *description)

{
  size_t sVar1;
  kj *this_00;
  StringPtr SVar2;
  
  (this->ownFile).content.ptr = (file->content).ptr;
  (this->ownFile).content.size_ = (file->content).size_;
  (this->ownFile).content.disposer = (file->content).disposer;
  (file->content).ptr = (char *)0x0;
  (file->content).size_ = 0;
  sVar1 = (this->ownFile).content.size_;
  if (sVar1 == 0) {
    this_00 = (kj *)0x28616d;
  }
  else {
    this_00 = (kj *)(this->ownFile).content.ptr;
  }
  SVar2.content.ptr = (char *)(sVar1 + (sVar1 == 0));
  SVar2.content.size_ = (size_t)file;
  SVar2 = trimSourceFilename(this_00,SVar2);
  this->file = SVar2.content.ptr;
  this->line = line;
  this->type = type;
  (this->description).content.ptr = (description->content).ptr;
  (this->description).content.size_ = (description->content).size_;
  (this->description).content.disposer = (description->content).disposer;
  (description->content).ptr = (char *)0x0;
  (description->content).size_ = 0;
  (this->context).ptr.disposer = (Disposer *)0x0;
  (this->context).ptr.ptr = (Context *)0x0;
  this->traceCount = 0;
  return;
}

Assistant:

Exception::Exception(Type type, String file, int line, String description) noexcept
    : ownFile(kj::mv(file)), file(trimSourceFilename(ownFile).cStr()), line(line), type(type),
      description(mv(description)), traceCount(0) {}